

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O3

_Bool getPrimaries(khr_df_primaries_e primaries,Primaries *p)

{
  sPrimaryMapping *psVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  sPrimaryMapping *psVar10;
  sPrimaryMapping *psVar11;
  _Bool _Var12;
  
  psVar10 = primaryMap;
  _Var12 = true;
  if (primaryMap[0].dfPrimaryEnum != primaries) {
    uVar9 = 0xffffffffffffffff;
    psVar11 = primaryMap;
    do {
      if (uVar9 == 9) {
        return false;
      }
      psVar10 = psVar11 + 1;
      uVar9 = uVar9 + 1;
      psVar1 = psVar11 + 1;
      psVar11 = psVar10;
    } while (psVar1->dfPrimaryEnum != primaries);
    _Var12 = uVar9 < 10;
  }
  fVar5 = (psVar10->primaries).Rx;
  fVar6 = (psVar10->primaries).Ry;
  fVar7 = (psVar10->primaries).Gx;
  fVar8 = (psVar10->primaries).Gy;
  fVar2 = (psVar10->primaries).By;
  fVar3 = (psVar10->primaries).Wx;
  fVar4 = (psVar10->primaries).Wy;
  p->Bx = (psVar10->primaries).Bx;
  p->By = fVar2;
  p->Wx = fVar3;
  p->Wy = fVar4;
  p->Rx = fVar5;
  p->Ry = fVar6;
  p->Gx = fVar7;
  p->Gy = fVar8;
  return _Var12;
}

Assistant:

bool getPrimaries(khr_df_primaries_e primaries, Primaries *p) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].dfPrimaryEnum == primaries) {
            *p = primaryMap[i].primaries;
            return true;
        }
    }

    /* No match */
    return false;
}